

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O1

void __thiscall Gluco::Solver::reduceDB(Solver *this)

{
  ClauseAllocator *lt;
  Clause *c;
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  this->nbReduceDB = this->nbReduceDB + 1;
  lt = &this->ca;
  sort<unsigned_int,reduceDB_lt>((this->learnts).data,(this->learnts).sz,(reduceDB_lt)lt);
  iVar8 = (this->learnts).sz;
  iVar7 = iVar8 / 2;
  puVar2 = (this->learnts).data;
  uVar5 = puVar2[iVar7];
  uVar1 = (this->ca).super_RegionAllocator<unsigned_int>.sz;
  if (uVar5 < uVar1) {
    puVar3 = (lt->super_RegionAllocator<unsigned_int>).memory;
    if ((puVar3[uVar5] & 0x7fffff80) == 0) {
      this->nbclausesbeforereduce = this->nbclausesbeforereduce + this->specialIncReduceDB;
    }
    uVar5 = puVar2[(long)iVar8 + -1];
    if (uVar5 < uVar1) {
      if ((puVar3[uVar5] & 0x7fffffc0) < 0xc0) {
        this->nbclausesbeforereduce = this->nbclausesbeforereduce + this->specialIncReduceDB;
      }
      if ((this->learnts).sz < 1) {
        iVar8 = 0;
      }
      else {
        lVar9 = 0;
        iVar8 = 0;
        do {
          uVar5 = (this->learnts).data[lVar9];
          if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= uVar5) goto LAB_005b936e;
          c = (Clause *)((lt->super_RegionAllocator<unsigned_int>).memory + uVar5);
          uVar5 = (uint)*(undefined8 *)&c->header;
          if ((((int)uVar5 < 0) && (0x40 < (uVar5 & 0x7fffffe0))) &&
             (2 < (int)((ulong)*(undefined8 *)&c->header >> 0x20))) {
            bVar4 = locked(this,c);
            if ((bVar4) || (iVar7 <= lVar9)) goto LAB_005b92d3;
            removeClause(this,(this->learnts).data[lVar9]);
            this->nbRemovedClauses = this->nbRemovedClauses + 1;
          }
          else {
LAB_005b92d3:
            iVar7 = iVar7 - ((int)~(uint)*(ulong *)&c->header >> 0x1f);
            *(ulong *)&c->header = *(ulong *)&c->header | 0x80000000;
            puVar2 = (this->learnts).data;
            lVar6 = (long)iVar8;
            iVar8 = iVar8 + 1;
            puVar2[lVar6] = puVar2[lVar9];
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < (this->learnts).sz);
        iVar8 = (int)lVar9 - iVar8;
      }
      vec<unsigned_int>::shrink(&this->learnts,iVar8);
      if ((double)(this->ca).super_RegionAllocator<unsigned_int>.sz * this->garbage_frac <
          (double)(this->ca).super_RegionAllocator<unsigned_int>.wasted_) {
        (*this->_vptr_Solver[3])(this);
        return;
      }
      return;
    }
  }
LAB_005b936e:
  __assert_fail("r >= 0 && r < sz",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Alloc.h"
                ,0x42,"T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]")
  ;
}

Assistant:

void Solver::reduceDB()
{ 
  int i, j;
  nbReduceDB++;
  sort(learnts, reduceDB_lt(ca));

  // We have a lot of "good" clauses, it is difficult to compare them. Keep more !
  if(ca[learnts[learnts.size() / RATIOREMOVECLAUSES]].lbd()<=3) nbclausesbeforereduce +=specialIncReduceDB; 
  // Useless :-)
  if(ca[learnts.last()].lbd()<=5)  nbclausesbeforereduce +=specialIncReduceDB;   
  
  // Don't delete binary or locked clauses. From the rest, delete clauses from the first half
  // Keep clauses which seem to be usefull (their lbd was reduce during this sequence)

  int limit = learnts.size() / 2;
  for (i = j = 0; i < learnts.size(); i++){
    Clause& c = ca[learnts[i]];
    if (c.lbd()>2 && c.size() > 2 && c.canBeDel() &&  !locked(c) && (i < limit)) {
      removeClause(learnts[i]);
      nbRemovedClauses++;
    }
    else {
      if(!c.canBeDel()) limit++; //we keep c, so we can delete an other clause
      c.setCanBeDel(true);       // At the next step, c can be delete
      learnts[j++] = learnts[i];
    }
  }
  learnts.shrink(i - j);
  checkGarbage();
}